

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

GenericDescriptor * __thiscall
ASDCP::MXF::GenericDescriptor::WriteToTLVSet(GenericDescriptor *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_GenericDescriptor_Locators);
      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                  MDD_GenericDescriptor_SubDescriptors);
        TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x528,
                "virtual ASDCP::Result_t ASDCP::MXF::GenericDescriptor::WriteToTLVSet(TLVWriter &)")
  ;
}

Assistant:

ASDCP::Result_t
GenericDescriptor::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(GenericDescriptor, Locators));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(GenericDescriptor, SubDescriptors));
  return result;
}